

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O0

void dlib::draw_line<int>(canvas *c,point *p1,point *p2,int *pixel,rectangle *area)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  long lVar8;
  rgb_alpha_pixel *src;
  canvas *in_RDI;
  double dVar9;
  double dVar10;
  double dVar11;
  double dy_1;
  double dx_1;
  double i_1;
  double y1f_1;
  double x1f_1;
  long y_2;
  long x_2;
  double last_1;
  double first_1;
  double slope_1;
  double dx;
  double dy;
  double i;
  double y1f;
  double x1f;
  long x_1;
  long y_1;
  double last;
  double first;
  double slope;
  long run;
  long rise;
  uchar max_alpha;
  rgb_alpha_pixel alpha_pixel;
  long x;
  long y;
  long y2;
  long x2;
  long y1;
  long x1;
  rectangle valid_area;
  rgb_alpha_pixel *in_stack_fffffffffffffda8;
  canvas *in_stack_fffffffffffffdb0;
  rectangle *in_stack_fffffffffffffdd8;
  rgb_alpha_pixel *prVar12;
  rectangle *in_stack_fffffffffffffde0;
  canvas *pcVar13;
  double local_120;
  double local_f8;
  double local_f0;
  double local_d0;
  double local_a8;
  double local_a0;
  rgb_alpha_pixel local_7c;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  rectangle local_48 [2];
  canvas *local_8;
  
  local_8 = in_RDI;
  rectangle::intersect(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  plVar4 = vector<long,_2L>::x((vector<long,_2L> *)0x45b9f9);
  local_50 = *plVar4;
  plVar4 = vector<long,_2L>::y((vector<long,_2L> *)0x45ba11);
  local_58 = *plVar4;
  plVar4 = vector<long,_2L>::x((vector<long,_2L> *)0x45ba29);
  local_60 = *plVar4;
  plVar4 = vector<long,_2L>::y((vector<long,_2L> *)0x45ba41);
  lVar5 = local_50;
  lVar6 = local_58;
  local_68 = *plVar4;
  if (local_50 == local_60) {
    plVar4 = rectangle::right(local_48);
    lVar6 = local_50;
    if ((lVar5 <= *plVar4) && (plVar4 = rectangle::left(local_48), *plVar4 <= lVar6)) {
      if (local_68 < local_58) {
        std::swap<long>(&local_58,&local_68);
      }
      plVar4 = rectangle::top(local_48);
      plVar4 = std::max<long>(&local_58,plVar4);
      local_58 = *plVar4;
      plVar4 = rectangle::bottom(local_48);
      plVar4 = std::min<long>(&local_68,plVar4);
      local_68 = *plVar4;
      for (local_70 = local_58; pcVar13 = local_8, lVar6 = local_70, local_70 <= local_68;
          local_70 = local_70 + 1) {
        lVar5 = rectangle::top(&local_8->super_rectangle);
        canvas::operator[](pcVar13,lVar6 - lVar5);
        rectangle::left(&local_8->super_rectangle);
        assign_pixel<dlib::canvas::pixel,int>
                  ((pixel *)in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8);
      }
    }
  }
  else if (local_58 == local_68) {
    plVar4 = rectangle::bottom(local_48);
    lVar5 = local_58;
    if ((lVar6 <= *plVar4) && (plVar4 = rectangle::top(local_48), *plVar4 <= lVar5)) {
      if (local_60 < local_50) {
        std::swap<long>(&local_50,&local_60);
      }
      plVar4 = rectangle::left(local_48);
      plVar4 = std::max<long>(&local_50,plVar4);
      local_50 = *plVar4;
      plVar4 = rectangle::right(local_48);
      plVar4 = std::min<long>(&local_60,plVar4);
      local_60 = *plVar4;
      for (local_78 = local_50; pcVar13 = local_8, lVar6 = local_58, local_78 <= local_60;
          local_78 = local_78 + 1) {
        lVar5 = rectangle::top(&local_8->super_rectangle);
        canvas::operator[](pcVar13,lVar6 - lVar5);
        rectangle::left(&local_8->super_rectangle);
        assign_pixel<dlib::canvas::pixel,int>
                  ((pixel *)in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8);
      }
    }
  }
  else {
    rgb_alpha_pixel::rgb_alpha_pixel(&local_7c);
    assign_pixel<dlib::rgb_alpha_pixel,int>
              ((rgb_alpha_pixel *)in_stack_fffffffffffffdb0,(int *)in_stack_fffffffffffffda8);
    uVar1 = local_7c.alpha;
    lVar6 = local_68 - local_58;
    lVar5 = local_60 - local_50;
    iVar2 = std::abs((int)lVar6);
    iVar3 = std::abs((int)lVar5);
    if (CONCAT44(extraout_var,iVar2) < CONCAT44(extraout_var_00,iVar3)) {
      if (local_60 < local_50) {
        plVar4 = rectangle::left(local_48);
        plVar4 = std::max<long>(&local_60,plVar4);
        lVar8 = *plVar4;
        plVar4 = rectangle::right(local_48);
        plVar4 = std::min<long>(&local_50,plVar4);
        lVar7 = *plVar4;
      }
      else {
        plVar4 = rectangle::left(local_48);
        plVar4 = std::max<long>(&local_50,plVar4);
        lVar8 = *plVar4;
        plVar4 = rectangle::right(local_48);
        plVar4 = std::min<long>(&local_60,plVar4);
        lVar7 = *plVar4;
      }
      local_a0 = (double)lVar8;
      local_a8 = (double)lVar7;
      dVar9 = (double)local_50;
      dVar10 = (double)local_58;
      for (local_d0 = local_a0; local_d0 <= local_a8; local_d0 = local_d0 + 1.0) {
        dVar11 = ((double)lVar6 / (double)lVar5) * (local_d0 - dVar9) + dVar10;
        lVar7 = (long)dVar11;
        plVar4 = rectangle::top(local_48);
        if ((*plVar4 <= lVar7) &&
           (plVar4 = rectangle::bottom(local_48), pcVar13 = local_8, lVar7 <= *plVar4)) {
          local_7c.alpha = (uchar)(int)((1.0 - (dVar11 - (double)lVar7)) * (double)uVar1);
          lVar8 = rectangle::top(&local_8->super_rectangle);
          canvas::operator[](pcVar13,lVar7 - lVar8);
          rectangle::left(&local_8->super_rectangle);
          assign_pixel<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                    ((pixel *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        }
        plVar4 = rectangle::top(local_48);
        if ((*plVar4 <= lVar7 + 1) &&
           (plVar4 = rectangle::bottom(local_48), pcVar13 = local_8, lVar7 + 1 <= *plVar4)) {
          local_7c.alpha = (uchar)(int)((dVar11 - (double)lVar7) * (double)uVar1);
          lVar8 = rectangle::top(&local_8->super_rectangle);
          canvas::operator[](pcVar13,(lVar7 + 1) - lVar8);
          rectangle::left(&local_8->super_rectangle);
          assign_pixel<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                    ((pixel *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        }
      }
    }
    else {
      if (local_68 < local_58) {
        plVar4 = rectangle::top(local_48);
        plVar4 = std::max<long>(&local_68,plVar4);
        lVar7 = *plVar4;
        plVar4 = rectangle::bottom(local_48);
        plVar4 = std::min<long>(&local_58,plVar4);
        lVar8 = *plVar4;
      }
      else {
        plVar4 = rectangle::top(local_48);
        plVar4 = std::max<long>(&local_58,plVar4);
        lVar7 = *plVar4;
        plVar4 = rectangle::bottom(local_48);
        plVar4 = std::min<long>(&local_68,plVar4);
        lVar8 = *plVar4;
      }
      local_f0 = (double)lVar7;
      local_f8 = (double)lVar8;
      dVar9 = (double)local_50;
      dVar10 = (double)local_58;
      for (local_120 = local_f0; local_120 <= local_f8; local_120 = local_120 + 1.0) {
        dVar11 = ((double)lVar5 / (double)lVar6) * (local_120 - dVar10) + dVar9;
        src = (rgb_alpha_pixel *)(long)local_120;
        lVar7 = (long)dVar11;
        plVar4 = rectangle::left(local_48);
        if ((*plVar4 <= lVar7) && (plVar4 = rectangle::right(local_48), lVar7 <= *plVar4)) {
          local_7c.alpha = (uchar)(int)((1.0 - (dVar11 - (double)lVar7)) * (double)uVar1);
          prVar12 = src;
          pcVar13 = local_8;
          lVar8 = rectangle::top(&local_8->super_rectangle);
          canvas::operator[](pcVar13,(long)prVar12 - lVar8);
          rectangle::left(&local_8->super_rectangle);
          assign_pixel<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                    ((pixel *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        }
        plVar4 = rectangle::left(local_48);
        if ((*plVar4 <= lVar7 + 1) && (plVar4 = rectangle::right(local_48), lVar7 + 1 <= *plVar4)) {
          local_7c.alpha = (uchar)(int)((dVar11 - (double)lVar7) * (double)uVar1);
          in_stack_fffffffffffffdb0 = local_8;
          lVar7 = rectangle::top(&local_8->super_rectangle);
          canvas::operator[](in_stack_fffffffffffffdb0,(long)src - lVar7);
          rectangle::left(&local_8->super_rectangle);
          assign_pixel<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                    ((pixel *)in_stack_fffffffffffffdb0,src);
          in_stack_fffffffffffffda8 = src;
        }
      }
    }
  }
  return;
}

Assistant:

void draw_line (
        const canvas& c,
        const point& p1,
        const point& p2,
        const pixel_type& pixel, 
        const rectangle& area = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                          std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
    )
    {
        rectangle valid_area(c.intersect(area));
        long x1 = p1.x();
        long y1 = p1.y();
        long x2 = p2.x();
        long y2 = p2.y();
        if (x1 == x2)
        {
            // if the x coordinate is inside the canvas's area
            if (x1 <= valid_area.right() && x1 >= valid_area.left())
            {
                // make sure y1 comes before y2
                if (y1 > y2)
                    swap(y1,y2);

                y1 = std::max(y1,valid_area.top());
                y2 = std::min(y2,valid_area.bottom());
                // this is a vertical line
                for (long y = y1; y <= y2; ++y)
                {
                    assign_pixel(c[y-c.top()][x1-c.left()], pixel);
                }
            }
        }
        else if (y1 == y2)
        {
            // if the y coordinate is inside the canvas's area
            if (y1 <= valid_area.bottom() && y1 >= valid_area.top())
            {
                // make sure x1 comes before x2
                if (x1 > x2)
                    swap(x1,x2);

                x1 = std::max(x1,valid_area.left());
                x2 = std::min(x2,valid_area.right());
                // this is a horizontal line
                for (long x = x1; x <= x2; ++x)
                {
                    assign_pixel(c[y1-c.top()][x-c.left()], pixel);
                }
            }
        }
        else
        {
            rgb_alpha_pixel alpha_pixel;
            assign_pixel(alpha_pixel, pixel);
            const unsigned char max_alpha = alpha_pixel.alpha;

            const long rise = (((long)y2) - ((long)y1));
            const long run = (((long)x2) - ((long)x1));
            if (std::abs(rise) < std::abs(run))
            {
                const double slope = ((double)rise)/run;

                double first, last;

                if (x1 > x2)                
                {
                    first = std::max(x2,valid_area.left());
                    last = std::min(x1,valid_area.right());
                }
                else
                {
                    first = std::max(x1,valid_area.left());
                    last = std::min(x2,valid_area.right());
                }                             


                long y;
                long x;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dy = slope*(i-x1f) + y1f;
                    const double dx = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);


                    if (y >= valid_area.top() && y <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dy-y))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (y+1 >= valid_area.top() && y+1 <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dy-y)*max_alpha);
                        assign_pixel(c[y+1-c.top()][x-c.left()], alpha_pixel);
                    }
                }         
            }
            else
            {
                const double slope = ((double)run)/rise;

                double first, last;

                if (y1 > y2)                
                {
                    first = std::max(y2,valid_area.top());
                    last = std::min(y1,valid_area.bottom());
                }
                else
                {
                    first = std::max(y1,valid_area.top());
                    last = std::min(y2,valid_area.bottom());
                }                             

                long x;
                long y;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dx = slope*(i-y1f) + x1f;
                    const double dy = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);

                    if (x >= valid_area.left() && x <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dx-x))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (x+1 >= valid_area.left() && x+1 <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dx-x)*max_alpha);
                        assign_pixel(c[y-c.top()][x+1-c.left()], alpha_pixel);
                    }
                } 
            }
        }

    }